

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Abc_ResubComputeFunction
              (void **ppDivs,int nDivs,int nWords,int nLimit,int nDivsMax,int iChoice,int fUseXor,
              int fDebug,int fVerbose,int **ppArray)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  undefined1 local_38 [4];
  int nGates;
  Vec_Ptr_t Divs;
  int iChoice_local;
  int nDivsMax_local;
  int nLimit_local;
  int nWords_local;
  int nDivs_local;
  void **ppDivs_local;
  
  local_38 = (undefined1  [4])nDivs;
  nGates = nDivs;
  Divs._0_8_ = ppDivs;
  Divs.pArray._4_4_ = iChoice;
  if (s_pResbMan == (Gia_ResbMan_t *)0x0) {
    __assert_fail("s_pResbMan != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x541,
                  "int Abc_ResubComputeFunction(void **, int, int, int, int, int, int, int, int, int **)"
                 );
  }
  Gia_ManResubPerform(s_pResbMan,(Vec_Ptr_t *)local_38,nWords,nLimit,nDivsMax,iChoice,fUseXor,fDebug
                      ,(uint)(fVerbose == 2));
  if (fVerbose != 0) {
    iVar1 = Vec_IntSize(s_pResbMan->vGates);
    uVar2 = iVar1 / 2;
    if (uVar2 != 0) {
      printf("      Gain = %2d  Gates = %2d  __________  F = ",(ulong)((nLimit + 1) - uVar2),
             (ulong)uVar2);
      Gia_ManResubPrint(s_pResbMan->vGates,nDivs);
      printf("\n");
    }
  }
  if ((fDebug != 0) && (iVar1 = Gia_ManResubVerify(s_pResbMan,(word *)0x0), iVar1 == 0)) {
    Gia_ManResubPrint(s_pResbMan->vGates,nDivs);
    printf("Verification FAILED.\n");
  }
  piVar3 = Vec_IntArray(s_pResbMan->vGates);
  *ppArray = piVar3;
  iVar1 = Vec_IntSize(s_pResbMan->vGates);
  if (nLimit < iVar1 / 2) {
    __assert_fail("Vec_IntSize(s_pResbMan->vGates)/2 <= nLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x558,
                  "int Abc_ResubComputeFunction(void **, int, int, int, int, int, int, int, int, int **)"
                 );
  }
  iVar1 = Vec_IntSize(s_pResbMan->vGates);
  return iVar1;
}

Assistant:

int Abc_ResubComputeFunction( void ** ppDivs, int nDivs, int nWords, int nLimit, int nDivsMax, int iChoice, int fUseXor, int fDebug, int fVerbose, int ** ppArray )
{
    Vec_Ptr_t Divs = { nDivs, nDivs, ppDivs };
    assert( s_pResbMan != NULL ); // first call Abc_ResubPrepareManager()
    Gia_ManResubPerform( s_pResbMan, &Divs, nWords, nLimit, nDivsMax, iChoice, fUseXor, fDebug, fVerbose==2 );
    if ( fVerbose )
    {
        int nGates = Vec_IntSize(s_pResbMan->vGates)/2;
        if ( nGates )
        {
            printf( "      Gain = %2d  Gates = %2d  __________  F = ", nLimit+1-nGates, nGates );
            Gia_ManResubPrint( s_pResbMan->vGates, nDivs );
            printf( "\n" );
        }
    }
    if ( fDebug )
    {
        if ( !Gia_ManResubVerify(s_pResbMan, NULL) )
        {
            Gia_ManResubPrint( s_pResbMan->vGates, nDivs );
            printf( "Verification FAILED.\n" );
        }
        //else
        //    printf( "Verification succeeded.\n" );
    }
    *ppArray = Vec_IntArray(s_pResbMan->vGates);
    assert( Vec_IntSize(s_pResbMan->vGates)/2 <= nLimit );
    return Vec_IntSize(s_pResbMan->vGates);
}